

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O0

size_t remove_trailing_zeroes(char *str)

{
  char *__dest;
  ushort **ppuVar1;
  size_t sVar2;
  char *in_RDI;
  bool bVar3;
  char *last_non_0;
  char *point;
  size_t removed;
  char *local_20;
  size_t local_10;
  char *local_8;
  
  local_8 = in_RDI;
  if (*in_RDI == '-') {
    local_8 = in_RDI + 1;
  }
  __dest = local_8 + 3;
  local_10 = 0;
  if (*__dest == '.') {
    local_8 = local_8 + 4;
    local_20 = (char *)0x0;
    while( true ) {
      bVar3 = false;
      if (*local_8 != '\0') {
        ppuVar1 = __ctype_b_loc();
        bVar3 = ((*ppuVar1)[(int)*local_8] & 0x1000) != 0;
      }
      if (!bVar3) break;
      if (*local_8 != '0') {
        local_20 = local_8;
      }
      local_8 = local_8 + 1;
    }
    if (local_20 == (char *)0x0) {
      sVar2 = strlen(local_8);
      memmove(__dest,local_8,sVar2 + 1);
      local_10 = (long)local_8 - (long)__dest;
    }
    else if (local_20 + 1 != local_8) {
      local_10 = (long)local_8 - (long)(local_20 + 1);
      sVar2 = strlen(local_8);
      memmove(local_20 + 1,local_8,sVar2 + 1);
    }
  }
  return local_10;
}

Assistant:

static size_t remove_trailing_zeroes(char* str)
{
    // [-]0xh.hhhh00000000p±d -> [-]0xh.hhhhp±d
    // [-]0xh.00000000p±d -> [-]0xh±d
    if (*str == '-') { ++str; }
    assert(*str == '0'); { ++str; }
    assert(*str == 'x'); { ++str; }
    assert(isxdigit(*str)); { ++str; }
    size_t removed = 0;
    if(*str == '.')
    {
        char* point = str;
        { ++str; }
        char* last_non_0 = NULL;
        for(; *str && isxdigit(*str); ++str)
        {
            if(*str != '0')
                last_non_0 = str;
        }
        assert(*str == 'p');
        if(last_non_0)
        {
            if(last_non_0 + 1 != str) {
                removed = str - (last_non_0 + 1);
                memmove(last_non_0 + 1, str, strlen(str)+1);
            }
        }
        else
        {
            memmove(point, str, strlen(str)+1);
            removed = str - point;
        }
    }
    else {
        assert(*str == 'p');
    }
    return removed;
}